

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_wrap.cpp
# Opt level: O0

int rsa_sign_wrap(mbedtls_pk_context *pk,mbedtls_md_type_t md_alg,uchar *hash,size_t hash_len,
                 uchar *sig,size_t sig_size,size_t *sig_len,
                 _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  size_t sVar1;
  mbedtls_rsa_context *in_RCX;
  int in_ESI;
  uchar *in_RDI;
  _func_int_void_ptr_uchar_ptr_size_t *in_R8;
  void *in_R9;
  mbedtls_rsa_context *rsa;
  mbedtls_rsa_context *ctx;
  int local_4;
  
  ctx = *(mbedtls_rsa_context **)(in_RDI + 8);
  if ((in_ESI == 0) && ((mbedtls_rsa_context *)0xffffffff < in_RCX)) {
    local_4 = -16000;
  }
  else {
    sVar1 = mbedtls_rsa_get_len(ctx);
    *(size_t *)rsa = sVar1;
    if (in_R9 < *(void **)rsa) {
      local_4 = -0x3880;
    }
    else {
      local_4 = mbedtls_rsa_pkcs1_sign
                          (in_RCX,in_R8,in_R9,(mbedtls_md_type_t)((ulong)ctx >> 0x20),(uint)ctx,
                           (uchar *)in_R8,in_RDI);
    }
  }
  return local_4;
}

Assistant:

static int rsa_sign_wrap(mbedtls_pk_context *pk, mbedtls_md_type_t md_alg,
                         const unsigned char *hash, size_t hash_len,
                         unsigned char *sig, size_t sig_size, size_t *sig_len,
                         int (*f_rng)(void *, unsigned char *, size_t), void *p_rng)
{
    mbedtls_rsa_context *rsa = (mbedtls_rsa_context *) pk->pk_ctx;

#if SIZE_MAX > UINT_MAX
    if (md_alg == MBEDTLS_MD_NONE && UINT_MAX < hash_len) {
        return MBEDTLS_ERR_PK_BAD_INPUT_DATA;
    }
#endif

    *sig_len = mbedtls_rsa_get_len(rsa);
    if (sig_size < *sig_len) {
        return MBEDTLS_ERR_PK_BUFFER_TOO_SMALL;
    }

    return mbedtls_rsa_pkcs1_sign(rsa, f_rng, p_rng,
                                  md_alg, (unsigned int) hash_len,
                                  hash, sig);
}